

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.cc
# Opt level: O3

void __thiscall
lf::mesh::hybrid2d::Quadrilateral::Quadrilateral
          (Quadrilateral *this,size_type index,
          unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *geometry
          ,Point *corner0,Point *corner1,Point *corner2,Point *corner3,Segment *edge0,Segment *edge1
          ,Segment *edge2,Segment *edge3)

{
  Geometry *pGVar1;
  Segment *pSVar2;
  Point *pPVar3;
  Point *pPVar4;
  Point *pPVar5;
  int iVar6;
  sub_idx_t sVar7;
  sub_idx_t sVar8;
  undefined4 extraout_var;
  long *plVar9;
  ostream *poVar10;
  runtime_error *prVar11;
  sub_idx_t sub_index;
  long lVar12;
  RefEl ref_el_quad;
  stringstream ss;
  string local_220;
  string local_200;
  string local_1e0;
  RefEl local_1b9;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR_Codim_00424420;
  this->index_ = index;
  (this->geometry_)._M_t.
  super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>._M_t.
  super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>.
  super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl =
       (geometry->_M_t).
       super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>.
       _M_t.
       super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
       .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
  (geometry->_M_t).
  super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>._M_t.
  super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>.
  super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl = (Geometry *)0x0;
  (this->nodes_)._M_elems[0] = corner0;
  (this->nodes_)._M_elems[1] = corner1;
  (this->nodes_)._M_elems[2] = corner2;
  (this->nodes_)._M_elems[3] = corner3;
  (this->edges_)._M_elems[0] = edge0;
  (this->edges_)._M_elems[1] = edge1;
  (this->edges_)._M_elems[2] = edge2;
  (this->edges_)._M_elems[3] = edge3;
  (this->edge_ori_)._M_elems[0] = ~negative;
  (this->edge_ori_)._M_elems[1] = ~negative;
  (this->edge_ori_)._M_elems[2] = ~negative;
  (this->edge_ori_)._M_elems[3] = ~negative;
  this->this_ = &this->super_Entity;
  if (corner0 == (Point *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid pointer to corner 0",0x1b)
    ;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"corner0 != nullptr","");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_200,&local_220,0x1b,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"this code should not be reached");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (corner1 == (Point *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid pointer to corner 1",0x1b)
    ;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"corner1 != nullptr","");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_200,&local_220,0x1c,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"this code should not be reached");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (corner2 == (Point *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid pointer to corner 2",0x1b)
    ;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"corner2 != nullptr","");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_200,&local_220,0x1d,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"this code should not be reached");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (corner3 == (Point *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid pointer to corner 3",0x1b)
    ;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"corner3 != nullptr","");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_200,&local_220,0x1e,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"this code should not be reached");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (edge0 == (Segment *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid pointer to edge 0",0x19);
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"edge0 != nullptr","");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_200,&local_220,0x1f,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"this code should not be reached");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (edge1 == (Segment *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid pointer to edge 1",0x19);
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"edge1 != nullptr","");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_200,&local_220,0x20,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"this code should not be reached");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (edge2 == (Segment *)0x0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid pointer to edge 2",0x19);
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"edge2 != nullptr","");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_200,&local_220,0x21,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"this code should not be reached");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (edge3 != (Segment *)0x0) {
    pGVar1 = (this->geometry_)._M_t.
             super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
             ._M_t.
             super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
             .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl;
    if (pGVar1 != (Geometry *)0x0) {
      iVar6 = (**pGVar1->_vptr_Geometry)();
      if (iVar6 != 2) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Geometry must describe a 2D cell",0x20);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_200,"geometry_->DimLocal() == 2","");
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_220,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_200,&local_220,0x25,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,"this code should not be reached");
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar6 = (*((this->geometry_)._M_t.
                 super___uniq_ptr_impl<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lf::geometry::Geometry_*,_std::default_delete<lf::geometry::Geometry>_>
                 .super__Head_base<0UL,_lf::geometry::Geometry_*,_false>._M_head_impl)->
                _vptr_Geometry[2])();
      if ((char)iVar6 != '\x04') {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Cell geometry must fit a quad",0x1d);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_200,"geometry_->RefEl() == base::RefEl::kQuad()","");
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_220,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_200,&local_220,0x27,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,"this code should not be reached");
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    local_1b9.type_ = kQuad;
    lVar12 = 0;
    while( true ) {
      pSVar2 = (this->edges_)._M_elems[lVar12];
      iVar6 = (*(pSVar2->super_Entity)._vptr_Entity[4])(pSVar2);
      sub_index = (sub_idx_t)lVar12;
      if ((char)iVar6 != '\x02') {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Wrong type for edge ",0x14);
        std::ostream::operator<<(local_1a8,sub_index);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_200,"ed_ptr->RefEl() == lf::base::RefEl::kSegment()","");
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_220,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_200,&local_220,0x34,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,"this code should not be reached");
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar6 = (*(pSVar2->super_Entity)._vptr_Entity[1])(pSVar2,1);
      sVar7 = base::RefEl::SubSubEntity2SubEntity(&local_1b9,1,sub_index,1,0);
      sVar8 = base::RefEl::SubSubEntity2SubEntity(&local_1b9,1,sub_index,1,1);
      if (3 < sVar7) {
        std::__throw_out_of_range_fmt
                  ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(ulong)sVar7,4);
      }
      if (3 < sVar8) {
        std::__throw_out_of_range_fmt
                  ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(ulong)sVar8,4);
      }
      pPVar3 = (this->nodes_)._M_elems[sVar7];
      pPVar4 = (this->nodes_)._M_elems[sVar8];
      pPVar5 = *(Point **)CONCAT44(extraout_var,iVar6);
      if ((pPVar5 != pPVar3) && (pPVar5 != pPVar4)) break;
      pPVar5 = (Point *)((long *)CONCAT44(extraout_var,iVar6))[1];
      if ((pPVar5 != pPVar3) && (pPVar5 != pPVar4)) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Node 1 of edge ",0xf);
        poVar10 = (ostream *)std::ostream::operator<<(local_1a8,sub_index);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," not a quad node",0x10);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_200,"(ed_nodes[1] == p0_ptr) || (ed_nodes[1] == p1_ptr)","");
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_220,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed(&local_200,&local_220,0x44,&local_1e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,"this code should not be reached");
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar12 = lVar12 + 1;
      if (lVar12 == 4) {
        lVar12 = -8;
        do {
          plVar9 = *(long **)((this->edge_ori_)._M_elems + lVar12);
          plVar9 = (long *)(**(code **)(*plVar9 + 8))(plVar9,1);
          *(uint *)((long)(&this->edge_ori_ + 1) + lVar12 * 2) =
               (uint)(*plVar9 == *(long *)((long)(this->edges_)._M_elems + lVar12 * 4)) * 2 + -1;
          lVar12 = lVar12 + 2;
        } while (lVar12 != 0);
        return;
      }
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Node 0 of edge ",0xf);
    poVar10 = (ostream *)std::ostream::operator<<(local_1a8,sub_index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," not a quad node",0x10);
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_200,"(ed_nodes[0] == p0_ptr) || (ed_nodes[0] == p1_ptr)","");
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed(&local_200,&local_220,0x42,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"this code should not be reached");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid pointer to edge 3",0x19);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"edge3 != nullptr","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/quad.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_200,&local_220,0x22,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar11,"this code should not be reached");
  __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Quadrilateral::Quadrilateral(size_type index,
                             std::unique_ptr<geometry::Geometry>&& geometry,
                             const Point* corner0, const Point* corner1,
                             const Point* corner2, const Point* corner3,
                             const Segment* edge0, const Segment* edge1,
                             const Segment* edge2, const Segment* edge3)
    : index_(index),
      geometry_(std::move(geometry)),
      nodes_({corner0, corner1, corner2, corner3}),
      edges_({edge0, edge1, edge2, edge3}),
      edge_ori_(),
      this_(this) {
  LF_VERIFY_MSG(corner0 != nullptr, "Invalid pointer to corner 0");
  LF_VERIFY_MSG(corner1 != nullptr, "Invalid pointer to corner 1");
  LF_VERIFY_MSG(corner2 != nullptr, "Invalid pointer to corner 2");
  LF_VERIFY_MSG(corner3 != nullptr, "Invalid pointer to corner 3");
  LF_VERIFY_MSG(edge0 != nullptr, "Invalid pointer to edge 0");
  LF_VERIFY_MSG(edge1 != nullptr, "Invalid pointer to edge 1");
  LF_VERIFY_MSG(edge2 != nullptr, "Invalid pointer to edge 2");
  LF_VERIFY_MSG(edge3 != nullptr, "Invalid pointer to edge 3");
  if (geometry_) {
    LF_VERIFY_MSG(geometry_->DimLocal() == 2,
                  "Geometry must describe a 2D cell");
    LF_VERIFY_MSG(geometry_->RefEl() == base::RefEl::kQuad(),
                  "Cell geometry must fit a quad");
  }

  // Consistency check: make sure that sub-entities of sub-entities
  // agree with sub-sub-entities

  const lf::base::RefEl ref_el_quad(lf::base::RefElType::kQuad);
  // Run through all edges
  for (int ed_loc_idx = 0; ed_loc_idx < 4; ed_loc_idx++) {
    // Pointer to current edge
    const Segment* ed_ptr = edges_.at(ed_loc_idx);
    // Check for segement type
    LF_VERIFY_MSG(ed_ptr->RefEl() == lf::base::RefEl::kSegment(),
                  "Wrong type for edge " << ed_loc_idx);
    // Fetch nodes from current edge
    auto ed_nodes = ed_ptr->SubEntities(1);

    // Obtain local indices of endpoints of edge
    const size_type loc_idx_p0 =
        ref_el_quad.SubSubEntity2SubEntity(1, ed_loc_idx, 1, 0);
    const size_type loc_idx_p1 =
        ref_el_quad.SubSubEntity2SubEntity(1, ed_loc_idx, 1, 1);
    const Point* p0_ptr = nodes_.at(loc_idx_p0);
    const Point* p1_ptr = nodes_.at(loc_idx_p1);

    // Verify that the nodes of the quadrilateral are nodes of the edge as well
    LF_VERIFY_MSG((ed_nodes[0] == p0_ptr) || (ed_nodes[0] == p1_ptr),
                  "Node 0 of edge " << ed_loc_idx << " not a quad node");
    LF_VERIFY_MSG((ed_nodes[1] == p0_ptr) || (ed_nodes[1] == p1_ptr),
                  "Node 1 of edge " << ed_loc_idx << " not a quad node");
  }

  // Finally set relative orientations for the edges. Edge i has positive
  // orientation, if its first node agrees with vertex i
  for (int ed_loc_idx = 0; ed_loc_idx < 4; ed_loc_idx++) {
    // Fetch nodes of current edge
    auto ed_nodes = edges_[ed_loc_idx]->SubEntities(1);
    edge_ori_[ed_loc_idx] = (ed_nodes[0] == nodes_[ed_loc_idx])
                                ? lf::mesh::Orientation::positive
                                : lf::mesh::Orientation::negative;
  }

}